

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O3

void __thiscall
cmExportBuildFileGenerator::SetImportLocationProperty
          (cmExportBuildFileGenerator *this,string *config,string *suffix,cmGeneratorTarget *target,
          ImportPropertyMap *properties)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  pointer ppcVar2;
  bool bVar3;
  TargetType TVar4;
  string *__rhs;
  mapped_type *pmVar5;
  char *pcVar6;
  pointer ppcVar7;
  string prop;
  string obj_dir;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objects;
  key_type local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  ImportPropertyMap *local_38;
  
  this_00 = target->Makefile;
  TVar4 = cmGeneratorTarget::GetType(target);
  if (TVar4 == OBJECT_LIBRARY) {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"IMPORTED_OBJECTS","");
    std::__cxx11::string::_M_append((char *)&local_d8,(ulong)(suffix->_M_dataplus)._M_p);
    local_78.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmGeneratorTarget::GetObjectSources(target,&local_78,config);
    local_38 = properties;
    cmGeneratorTarget::GetObjectDirectory(&local_b8,target,config);
    ppcVar2 = local_78.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_78.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_78.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      ppcVar7 = local_78.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        __rhs = cmGeneratorTarget::GetObjectName_abi_cxx11_(target,*ppcVar7);
        std::operator+(&local_98,&local_b8,__rhs);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_58,
                   &local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        ppcVar7 = ppcVar7 + 1;
      } while (ppcVar7 != ppcVar2);
    }
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_98,&local_58,";");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_38,&local_d8);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,
                      CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                               local_b8.field_2._M_local_buf[0]) + 1);
    }
    if (local_78.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p == &local_d8.field_2) {
      return;
    }
  }
  else {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"IMPORTED_LOCATION","");
    std::__cxx11::string::_M_append((char *)&local_d8,(ulong)(suffix->_M_dataplus)._M_p);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    local_b8._M_string_length = 0;
    local_b8.field_2._M_local_buf[0] = '\0';
    bVar3 = cmGeneratorTarget::IsAppBundleOnApple(target);
    if (bVar3) {
      cmGeneratorTarget::GetFullPath(&local_98,target,config,RuntimeBinaryArtifact,false);
    }
    else {
      cmGeneratorTarget::GetFullPath(&local_98,target,config,RuntimeBinaryArtifact,true);
    }
    std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    paVar1 = &local_d8.field_2;
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](properties,&local_d8);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,
                      CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                               local_b8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    bVar3 = cmGeneratorTarget::HasImportLibrary(target,config);
    if (!bVar3) {
      return;
    }
    local_d8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"CMAKE_IMPORT_LIBRARY_SUFFIX","");
    pcVar6 = cmMakefile::GetDefinition(this_00,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if (pcVar6 == (char *)0x0) {
      return;
    }
    local_d8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"IMPORTED_IMPLIB","");
    std::__cxx11::string::_M_append((char *)&local_d8,(ulong)(suffix->_M_dataplus)._M_p);
    cmGeneratorTarget::GetFullPath(&local_b8,target,config,ImportLibraryArtifact,false);
    cmGeneratorTarget::GetImplibGNUtoMS
              (target,config,&local_b8,&local_b8,"${CMAKE_IMPORT_LIBRARY_SUFFIX}");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](properties,&local_d8);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,
                      CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                               local_b8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p == paVar1) {
      return;
    }
  }
  operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void cmExportBuildFileGenerator::SetImportLocationProperty(
  const std::string& config, std::string const& suffix,
  cmGeneratorTarget* target, ImportPropertyMap& properties)
{
  // Get the makefile in which to lookup target information.
  cmMakefile* mf = target->Makefile;

  if (target->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    std::string prop = "IMPORTED_OBJECTS";
    prop += suffix;

    // Compute all the object files inside this target and setup
    // IMPORTED_OBJECTS as a list of object files
    std::vector<cmSourceFile const*> objectSources;
    target->GetObjectSources(objectSources, config);
    std::string const obj_dir = target->GetObjectDirectory(config);
    std::vector<std::string> objects;
    for (cmSourceFile const* sf : objectSources) {
      const std::string& obj = target->GetObjectName(sf);
      objects.push_back(obj_dir + obj);
    }

    // Store the property.
    properties[prop] = cmJoin(objects, ";");
  } else {
    // Add the main target file.
    {
      std::string prop = "IMPORTED_LOCATION";
      prop += suffix;
      std::string value;
      if (target->IsAppBundleOnApple()) {
        value =
          target->GetFullPath(config, cmStateEnums::RuntimeBinaryArtifact);
      } else {
        value = target->GetFullPath(config,
                                    cmStateEnums::RuntimeBinaryArtifact, true);
      }
      properties[prop] = value;
    }

    // Add the import library for windows DLLs.
    if (target->HasImportLibrary(config) &&
        mf->GetDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX")) {
      std::string prop = "IMPORTED_IMPLIB";
      prop += suffix;
      std::string value =
        target->GetFullPath(config, cmStateEnums::ImportLibraryArtifact);
      target->GetImplibGNUtoMS(config, value, value,
                               "${CMAKE_IMPORT_LIBRARY_SUFFIX}");
      properties[prop] = value;
    }
  }
}